

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport_tcp.cpp
# Opt level: O0

ssize_t __thiscall miniros::TransportTCP::write(TransportTCP *this,int __fd,void *__buf,size_t __n)

{
  socket_fd_t sVar1;
  bool bVar2;
  uint *puVar3;
  ssize_t sVar4;
  char *pcVar5;
  undefined4 in_register_00000034;
  bool enabled_1;
  int num_bytes;
  uint32_t writesize;
  bool enabled;
  scoped_lock<std::recursive_mutex> lock;
  mutex_type *in_stack_ffffffffffffff18;
  Level LVar6;
  socket_fd_t in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  LogLocation *in_stack_ffffffffffffff30;
  void *logger_handle;
  Level in_stack_ffffffffffffff44;
  string *in_stack_ffffffffffffff48;
  string *name;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  allocator<char> *in_stack_ffffffffffffff58;
  undefined1 local_91 [37];
  uint local_6c;
  uint local_68;
  uint local_64;
  int local_60;
  undefined1 local_5a;
  allocator<char> local_59;
  string local_58 [60];
  uint local_1c;
  void *local_18;
  TransportTCP *local_10;
  uint local_4;
  
  local_18 = (void *)CONCAT44(in_register_00000034,__fd);
  local_1c = (uint)__buf;
  local_10 = this;
  std::scoped_lock<std::recursive_mutex>::scoped_lock
            ((scoped_lock<std::recursive_mutex> *)
             CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),in_stack_ffffffffffffff18
            );
  LVar6 = (Level)((ulong)in_stack_ffffffffffffff18 >> 0x20);
  if ((this->closed_ & 1U) == 0) {
    local_60 = 0;
  }
  else {
    if (((console::g_initialized ^ 0xff) & 1) != 0) {
      console::initialize();
    }
    if (((write::loc.initialized_ ^ 0xffU) & 1) != 0) {
      in_stack_ffffffffffffff58 = &local_59;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                 (char *)in_stack_ffffffffffffff58,
                 (allocator<char> *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
      console::initializeLogLocation
                ((LogLocation *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                 in_stack_ffffffffffffff48,in_stack_ffffffffffffff44);
      std::__cxx11::string::~string(local_58);
      std::allocator<char>::~allocator(&local_59);
    }
    if (write::loc.level_ != Debug) {
      console::setLogLocationLevel
                ((LogLocation *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),LVar6)
      ;
      console::checkLogLocationEnabled(in_stack_ffffffffffffff30);
    }
    in_stack_ffffffffffffff57 = (write::loc.logger_enabled_ & 1U) != 0;
    local_5a = in_stack_ffffffffffffff57;
    if ((bool)in_stack_ffffffffffffff57) {
      in_stack_ffffffffffffff20 = this->sock_;
      LVar6 = Debug;
      console::print((FilterBase *)0x0,write::loc.logger_,(Level)(ulong)write::loc.level_,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/transport/transport_tcp.cpp"
                     ,0x214,"virtual int32_t miniros::TransportTCP::write(uint8_t *, uint32_t)");
    }
    local_4 = 0xffffffff;
    local_60 = 1;
  }
  std::scoped_lock<std::recursive_mutex>::~scoped_lock
            ((scoped_lock<std::recursive_mutex> *)0x50e52b);
  if (local_60 == 0) {
    local_68 = 0x7fffffff;
    puVar3 = std::min<unsigned_int>(&local_1c,&local_68);
    local_64 = *puVar3;
    sVar4 = send(this->sock_,local_18,(ulong)local_64,0);
    local_6c = (uint)sVar4;
    if ((int)local_6c < 0) {
      bVar2 = last_socket_error_is_would_block();
      if (bVar2) {
        local_6c = 0;
      }
      else {
        if (((console::g_initialized ^ 0xff) & 1) != 0) {
          console::initialize();
        }
        if (((write(unsigned_char*,unsigned_int)::loc.initialized_ ^ 0xffU) & 1) != 0) {
          name = (string *)local_91;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                     (char *)in_stack_ffffffffffffff58,
                     (allocator<char> *)
                     CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
          console::initializeLogLocation
                    ((LogLocation *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                     name,in_stack_ffffffffffffff44);
          std::__cxx11::string::~string((string *)(local_91 + 1));
          std::allocator<char>::~allocator((allocator<char> *)local_91);
        }
        if (write(unsigned_char*,unsigned_int)::loc.level_ != Debug) {
          console::setLogLocationLevel
                    ((LogLocation *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                     LVar6);
          console::checkLogLocationEnabled(in_stack_ffffffffffffff30);
        }
        LVar6 = write(unsigned_char*,unsigned_int)::loc.level_;
        if ((write(unsigned_char*,unsigned_int)::loc.logger_enabled_ & 1U) != 0) {
          sVar1 = this->sock_;
          logger_handle = write(unsigned_char*,unsigned_int)::loc.logger_;
          pcVar5 = last_socket_error_string();
          console::print((FilterBase *)0x0,logger_handle,(Level)(ulong)LVar6,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/transport/transport_tcp.cpp"
                         ,0x222,"virtual int32_t miniros::TransportTCP::write(uint8_t *, uint32_t)",
                         "send() on socket [%d] failed with error [%s]",sVar1,pcVar5);
        }
        (*(this->super_Transport)._vptr_Transport[8])();
      }
    }
    local_4 = local_6c;
  }
  return (ulong)local_4;
}

Assistant:

int32_t TransportTCP::write(uint8_t* buffer, uint32_t size)
{
  {
    std::scoped_lock<std::recursive_mutex> lock(close_mutex_);

    if (closed_)
    {
      MINIROS_DEBUG("Tried to write on a closed socket [%d]", sock_);
      return -1;
    }
  }

  MINIROS_ASSERT(size > 0);

  // never write more than INT_MAX since this is the maximum we can report back with the current return type
  uint32_t writesize = std::min<uint32_t>(size, static_cast<uint32_t>(INT_MAX));
  int num_bytes = ::send(sock_, reinterpret_cast<const char*>(buffer), writesize, 0);
  if (num_bytes < 0)
  {
    if ( !last_socket_error_is_would_block() )
    {
      MINIROS_DEBUG("send() on socket [%d] failed with error [%s]", sock_, last_socket_error_string());
      close();
    }
    else
    {
      num_bytes = 0;
    }
  }

  return num_bytes;
}